

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::SingularVarBigint<unsigned_long,unsigned_short,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  uint *puVar6;
  ParseContext *ctx_00;
  ulong uVar7;
  ushort *puVar8;
  
  cVar1 = *ptr;
  if (-1 < (long)cVar1) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  uVar7 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar7 < 0) {
    ctx_00 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
    if ((long)ctx_00 < 0) {
      uVar7 = uVar7 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar7 < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[4] << 0x1c | 0xfffffffU));
        if ((long)ctx_00 < 0) {
          uVar7 = uVar7 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar7 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
            if ((long)ctx_00 < 0) {
              uVar7 = uVar7 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar7 < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                if ((long)ctx_00 < 0) {
                  bVar2 = ptr[9];
                  puVar8 = (ushort *)(ptr + 10);
                  if (bVar2 != 1) {
                    if ((char)bVar2 < '\0') {
                      pcVar5 = Error(msg,(char *)CONCAT71(0xffffffffffffff,bVar2),ctx_00,data,table,
                                     hasbits);
                      return pcVar5;
                    }
                    if ((bVar2 & 1) == 0) {
                      ctx_00 = (ParseContext *)((ulong)ctx_00 ^ 0x8000000000000000);
                    }
                  }
                }
                else {
                  puVar8 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar8 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar8 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar8 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar8 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar8 = (ushort *)(ptr + 4);
      }
    }
    else {
      puVar8 = (ushort *)(ptr + 3);
    }
    uVar7 = uVar7 & (ulong)ctx_00;
  }
  else {
    puVar8 = (ushort *)(ptr + 2);
  }
  puVar4 = RefAt<unsigned_long>(msg,(ulong)data.field_0 >> 0x30);
  *puVar4 = uVar7 & (long)cVar1;
  if (puVar8 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar3 = (uint)table->fast_idx_mask & (uint)*puVar8;
    if ((uVar3 & 7) == 0) {
      uVar7 = (ulong)(uVar3 & 0xfffffff8);
      pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                 (msg,puVar8,ctx,
                                  (ulong)*puVar8 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),
                                  table,hasbits);
      return pcVar5;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar6 = *puVar6 | (uint)hasbits;
  }
  return (char *)puVar8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}